

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O0

void * vk::anon_unknown_5::mapMemory
                 (DeviceInterface *vkd,VkDevice device,VkDeviceMemory mem,VkDeviceSize offset,
                 VkDeviceSize size,VkMemoryMapFlags flags)

{
  VkResult result;
  deBool dVar1;
  TestError *this;
  void *local_40;
  void *hostPtr;
  VkDeviceSize VStack_30;
  VkMemoryMapFlags flags_local;
  VkDeviceSize size_local;
  VkDeviceSize offset_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  VkDeviceMemory mem_local;
  
  local_40 = (void *)0x0;
  hostPtr._4_4_ = flags;
  VStack_30 = size;
  size_local = offset;
  offset_local = (VkDeviceSize)device;
  device_local = (VkDevice)vkd;
  vkd_local = (DeviceInterface *)mem.m_internal;
  result = (*vkd->_vptr_DeviceInterface[7])
                     (vkd,device,mem.m_internal,offset,size,(ulong)flags,&local_40);
  checkResult(result,"vkd.mapMemory(device, mem, offset, size, flags, &hostPtr)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
              ,0x3c);
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || (local_40 == (void *)0x0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      return local_40;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"hostPtr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
             ,0x3d);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void* mapMemory (const DeviceInterface& vkd, VkDevice device, VkDeviceMemory mem, VkDeviceSize offset, VkDeviceSize size, VkMemoryMapFlags flags)
{
	void* hostPtr = DE_NULL;
	VK_CHECK(vkd.mapMemory(device, mem, offset, size, flags, &hostPtr));
	TCU_CHECK(hostPtr);
	return hostPtr;
}